

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O0

short * vrna_seq_encode(char *sequence,vrna_md_t *md)

{
  size_t sVar1;
  short *local_28;
  short *S;
  uint l;
  uint i;
  vrna_md_t *md_local;
  char *sequence_local;
  
  local_28 = (short *)0x0;
  if ((sequence != (char *)0x0) && (md != (vrna_md_t *)0x0)) {
    local_28 = vrna_seq_encode_simple(sequence,md);
    sVar1 = strlen(sequence);
    for (S._4_4_ = 1; S._4_4_ <= (uint)sVar1; S._4_4_ = S._4_4_ + 1) {
      local_28[S._4_4_] = md->alias[local_28[S._4_4_]];
    }
    local_28[(uint)sVar1 + 1] = local_28[1];
    *local_28 = local_28[sVar1 & 0xffffffff];
  }
  return local_28;
}

Assistant:

PUBLIC short *
vrna_seq_encode(const char  *sequence,
                vrna_md_t   *md)
{
  unsigned int  i, l;
  short         *S = NULL;

  if (sequence && md) {
    S = vrna_seq_encode_simple(sequence, md);

    l = (unsigned int)strlen(sequence);

    for (i = 1; i <= l; i++)
      S[i] = md->alias[S[i]];

    S[l + 1]  = S[1];
    S[0]      = S[l];
  }

  return S;
}